

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::ComputeShaderExecutor::ComputeShaderExecutor
          (ComputeShaderExecutor *this,RenderContext *renderCtx,ShaderSpec *shaderSpec)

{
  ProgramSources *sources;
  ShaderSpec *spec;
  Vector<int,_3> local_150 [2];
  string local_138;
  ShaderSource local_118;
  ProgramSources local_f0;
  ComputeShaderExecutor *local_20;
  ShaderSpec *shaderSpec_local;
  RenderContext *renderCtx_local;
  ComputeShaderExecutor *this_local;
  
  local_20 = (ComputeShaderExecutor *)shaderSpec;
  shaderSpec_local = (ShaderSpec *)renderCtx;
  renderCtx_local = (RenderContext *)this;
  glu::ProgramSources::ProgramSources(&local_f0);
  generateComputeShader_abi_cxx11_(&local_138,local_20,spec);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_118,&local_138);
  sources = glu::ProgramSources::operator<<(&local_f0,&local_118);
  BufferIoExecutor::BufferIoExecutor(&this->super_BufferIoExecutor,renderCtx,shaderSpec,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  glu::ProgramSources::~ProgramSources(&local_f0);
  (this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor =
       (_func_int **)&PTR__ComputeShaderExecutor_011e6300;
  tcu::Vector<int,_3>::Vector(&this->m_maxWorkSize);
  tcu::Vector<int,_3>::Vector(local_150,0x80,0x80,0x40);
  *(undefined8 *)(this->m_maxWorkSize).m_data = local_150[0].m_data._0_8_;
  (this->m_maxWorkSize).m_data[2] = local_150[0].m_data[2];
  return;
}

Assistant:

ComputeShaderExecutor::ComputeShaderExecutor (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec)
	: BufferIoExecutor	(renderCtx, shaderSpec,
						 glu::ProgramSources() << glu::ComputeSource(generateComputeShader(shaderSpec)))
{
	m_maxWorkSize	= tcu::IVec3(128,128,64); // Minimum in 3plus
}